

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocFreePages<false>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  undefined4 *puVar1;
  code *pcVar2;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_00;
  bool bVar3;
  int iVar4;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_01;
  char *address;
  ulong uVar5;
  undefined8 *in_FS_OFFSET;
  Iterator local_50;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *local_40;
  PageSegmentBase<Memory::VirtualAllocWrapper> **local_38;
  
  uVar5 = (ulong)pageCount;
  iVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x3e5,"(!HasMultiThreadAccess())","!HasMultiThreadAccess()");
    if (!bVar3) {
LAB_00281313:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (this->freePageCount < uVar5) {
LAB_0028128d:
    address = TryAllocFromZeroPages(this,pageCount,pageSegment);
  }
  else {
    local_50.list = &this->segments;
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    local_50.current =
         &(local_50.list)->
          super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
    local_40 = this;
    local_38 = pageSegment;
    do {
      if ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
          local_50.current ==
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar3) goto LAB_00281313;
        *puVar1 = 0;
      }
      pageSegment = local_38;
      this = local_40;
      if ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
          ((local_50.current)->next).base == local_50.list) goto LAB_0028128d;
      local_50.current = (NodeBase *)((local_50.current)->next).base;
      this_01 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator
                ::Data(&local_50);
      address = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>(this_01,pageCount);
      this_00 = local_40;
    } while (address == (char *)0x0);
    LogAllocPages(local_40,uVar5);
    if (this_01->freePageCount == 0) {
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::EditingIterator::
      MoveCurrentTo((EditingIterator *)&local_50,&this_00->fullSegments);
    }
    uVar5 = this_00->freePageCount - uVar5;
    this_00->freePageCount = uVar5;
    *local_38 = this_01;
    if (uVar5 < this_00->debugMinFreePageCount) {
      this_00->debugMinFreePageCount = uVar5;
    }
    FillAllocPages(this_00,address,pageCount);
  }
  return address;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFreePages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!HasMultiThreadAccess());
    char* pages = nullptr;

    if (this->freePageCount >= pageCount)
    {
        FAULTINJECT_MEMORY_NOTHROW(this->debugName, pageCount*AutoSystemInfo::PageSize);
        typename DListBase<TPageSegment>::EditingIterator i(&this->segments);

        while (i.Next())
        {
            TPageSegment * freeSegment = &i.Data();

            pages = freeSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                LogAllocPages(pageCount);
                if (freeSegment->GetFreePageCount() == 0)
                {
                    i.MoveCurrentTo(&this->fullSegments);
                }

                this->freePageCount -= pageCount;
                *pageSegment = freeSegment;

#if DBG
                UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
                this->FillAllocPages(pages, pageCount);
                return pages;
            }
        }
    }

    pages = TryAllocFromZeroPages(pageCount, pageSegment);

    return pages;
}